

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

TimerId __thiscall
sznet::TimerQueue::addTimer(TimerQueue *this,TimerCallback *cb,Timestamp when,double interval)

{
  EventLoop *this_00;
  TimerId TVar1;
  _Bind<void_(sznet::TimerQueue::*(sznet::TimerQueue_*,_sznet::Timer_*))(sznet::Timer_*)> local_90;
  function<void_()> local_70;
  Functor local_50;
  double local_30;
  
  local_30 = interval;
  TVar1.m_timer = (Timer *)operator_new(0x48);
  std::function<void_()>::function(&local_70,cb);
  Timer::Timer(TVar1.m_timer,&local_70,when,local_30);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  this_00 = this->m_loop;
  local_90._M_f = (offset_in_TimerQueue_to_subr)addTimerInLoop;
  local_90._8_8_ = 0;
  local_90._M_bound_args.super__Tuple_impl<0UL,_sznet::TimerQueue_*,_sznet::Timer_*>.
  super__Tuple_impl<1UL,_sznet::Timer_*>.super__Head_base<1UL,_sznet::Timer_*,_false>._M_head_impl =
       (_Head_base<1UL,_sznet::Timer_*,_false>)(_Head_base<1UL,_sznet::Timer_*,_false>)TVar1.m_timer
  ;
  local_90._M_bound_args.super__Tuple_impl<0UL,_sznet::TimerQueue_*,_sznet::Timer_*>.
  super__Head_base<0UL,_sznet::TimerQueue_*,_false>._M_head_impl = this;
  std::function<void()>::
  function<std::_Bind<void(sznet::TimerQueue::*(sznet::TimerQueue*,sznet::Timer*))(sznet::Timer*)>,void>
            ((function<void()> *)&local_50,&local_90);
  net::EventLoop::runInLoop(this_00,&local_50);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  TVar1.m_sequence = (TVar1.m_timer)->m_sequence;
  return TVar1;
}

Assistant:

TimerId TimerQueue::addTimer(const net::TimerCallback cb, Timestamp when, double interval)
{
	Timer* timer = new Timer(cb, when, interval);
	m_loop->runInLoop(std::bind(&TimerQueue::addTimerInLoop, this, timer));
	return TimerId(timer, timer->sequence());
}